

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

Expression * __thiscall
soul::RewritingASTVisitor::visitObject(RewritingASTVisitor *this,Expression *t)

{
  int iVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  string local_30;
  
  switch((t->super_Statement).super_ASTObject.objectType) {
  case ConcreteType:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x21];
    break;
  case SubscriptWithBrackets:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x26];
    break;
  case SubscriptWithChevrons:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x27];
    break;
  case TypeMetaFunction:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x28];
    break;
  case Assignment:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0xd];
    break;
  case BinaryOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[9];
    break;
  case Constant:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[7];
    break;
  case DotOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x36];
    break;
  case CallOrCast:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0xe];
    break;
  case FunctionCall:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0xf];
    break;
  case TypeCast:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x10];
    break;
  case PreOrPostIncOrDec:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x14];
    break;
  case InPlaceOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x15];
    break;
  case ArrayElementRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x11];
    break;
  case StructMemberRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x12];
    break;
  case ComplexMemberRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x13];
    break;
  case StructDeclaration:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x22];
    break;
  case StructDeclarationRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x23];
    break;
  case UsingDeclaration:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x24];
    break;
  case TernaryOp:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x17];
    break;
  case UnaryOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[10];
    break;
  case QualifiedIdentifier:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x34];
    break;
  case UnqualifiedName:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x35];
    break;
  case VariableRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0xc];
    break;
  case InputEndpointRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x2b];
    break;
  case OutputEndpointRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x2c];
    break;
  case ConnectionEndpointRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x2d];
    break;
  case ProcessorRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x30];
    break;
  case NamespaceRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x31];
    break;
  case ProcessorInstanceRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x32];
    break;
  case CommaSeparatedList:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x33];
    break;
  case ProcessorProperty:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x1e];
    break;
  case WriteToEndpoint:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x1d];
    break;
  case AdvanceClock:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x1f];
    break;
  case StaticAssertion:
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[0x37];
    break;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown AST expression","")
    ;
    throwInternalCompilerError(&local_30);
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)();
  return (Expression *)CONCAT44(extraout_var,iVar1);
}

Assistant:

AST::Expression& visitObject (AST::Expression& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_EXPRESSIONS (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST expression"); return t;
        }
    }